

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint shift;
  uint shiftLo;
  uint shiftHi;
  uint Rm;
  uint Rn;
  uint Rd;
  
  RegNo = fieldFromInstruction(in_ESI,0,5);
  fieldFromInstruction(in_ESI,5,5);
  uVar1 = fieldFromInstruction(in_ESI,0x10,5);
  uVar2 = fieldFromInstruction(in_ESI,0x16,2);
  uVar3 = fieldFromInstruction(in_ESI,10,6);
  uVar4 = uVar2 << 6 | uVar3;
  uVar5 = MCInst_getOpcode(in_RDI);
  if (uVar5 == 0x32) {
LAB_002dcf41:
    if (uVar2 == 3) {
      return MCDisassembler_Fail;
    }
  }
  else {
    if (uVar5 == 0x36) {
LAB_002dcfba:
      if (uVar2 == 3) {
        return MCDisassembler_Fail;
      }
LAB_002dcfcd:
      DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar4));
      DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar4));
      DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar4));
      goto LAB_002dd015;
    }
    if (uVar5 == 0x40) goto LAB_002dcf41;
    if (uVar5 == 0x44) goto LAB_002dcfba;
    if (uVar5 != 0x59) {
      if (uVar5 != 0x5c) {
        if (uVar5 == 0x5f) goto LAB_002dcf57;
        if (uVar5 != 0x62) {
          if (uVar5 == 0x6b) goto LAB_002dcf57;
          if (uVar5 != 0x6d) {
            if (uVar5 == 0x6f) goto LAB_002dcf57;
            if (uVar5 != 0x71) {
              if (uVar5 == 0x123) goto LAB_002dcf57;
              if (uVar5 != 0x125) {
                if (uVar5 == 0x128) goto LAB_002dcf57;
                if (uVar5 != 299) {
                  if (uVar5 == 0x482) goto LAB_002dcf57;
                  if (uVar5 != 0x484) {
                    if (uVar5 == 0x489) goto LAB_002dcf57;
                    if (uVar5 != 0x48c) {
                      if (uVar5 == 0x79f) goto LAB_002dcf41;
                      if (uVar5 != 0x7a3) {
                        if (uVar5 == 0x7a8) goto LAB_002dcf41;
                        if (uVar5 != 0x7ac) {
                          return MCDisassembler_Fail;
                        }
                      }
                      goto LAB_002dcfba;
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_002dcfcd;
    }
  }
LAB_002dcf57:
  if (uVar3 >> 5 == 1) {
    return MCDisassembler_Fail;
  }
  DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar4));
  DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar4));
  DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar4));
LAB_002dd015:
  MCOperand_CreateImm0(in_RDI,(ulong)uVar4);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rm = fieldFromInstruction(insn, 16, 5);
	unsigned shiftHi = fieldFromInstruction(insn, 22, 2);
	unsigned shiftLo = fieldFromInstruction(insn, 10, 6);
	unsigned shift = (shiftHi << 6) | shiftLo;

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_ADDWrs:
		case AArch64_ADDSWrs:
		case AArch64_SUBWrs:
		case AArch64_SUBSWrs:
			// if shift == '11' then ReservedValue()
			if (shiftHi == 0x3)
				return Fail;
			// Deliberate fallthrough
		case AArch64_ANDWrs:
		case AArch64_ANDSWrs:
		case AArch64_BICWrs:
		case AArch64_BICSWrs:
		case AArch64_ORRWrs:
		case AArch64_ORNWrs:
		case AArch64_EORWrs:
		case AArch64_EONWrs: {
				// if sf == '0' and imm6<5> == '1' then ReservedValue()
				if (shiftLo >> 5 == 1)
					return Fail;
				DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
				break;
			}
		case AArch64_ADDXrs:
		case AArch64_ADDSXrs:
		case AArch64_SUBXrs:
		case AArch64_SUBSXrs:
				 // if shift == '11' then ReservedValue()
				 if (shiftHi == 0x3)
					 return Fail;
				 // Deliberate fallthrough
		case AArch64_ANDXrs:
		case AArch64_ANDSXrs:
		case AArch64_BICXrs:
		case AArch64_BICSXrs:
		case AArch64_ORRXrs:
		case AArch64_ORNXrs:
		case AArch64_EORXrs:
		case AArch64_EONXrs:
				 DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
				 break;
	}

	MCOperand_CreateImm0(Inst, shift);
	return Success;
}